

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diy_fp.h
# Opt level: O0

pair<floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>_>
 floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>::boundaries(float d)

{
  mantissa_storage_type mVar1;
  byte bVar2;
  mantissa_storage_type mVar3;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> dStack_38;
  uchar shift_amount;
  pair<floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>_>
  *local_30;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> *pl;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> *mi;
  undefined1 auStack_18 [4];
  float d_local;
  pair<floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>_>
  result;
  
  mi._4_4_ = d;
  std::
  pair<floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>_>
  ::
  pair<floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_true>
            ((pair<floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>_>
              *)auStack_18);
  local_30 = &result;
  pl = (diy_fp<float,_floaxie::diy_fp_traits<float>_> *)auStack_18;
  diy_fp(&stack0xffffffffffffffc8,mi._4_4_);
  local_30->first = dStack_38;
  *pl = local_30->first;
  (local_30->first).m_f = (local_30->first).m_f * 2;
  (local_30->first).m_f = (local_30->first).m_f + 1;
  (local_30->first).m_e = (local_30->first).m_e + -1;
  normalize_from_ieee754(&local_30->first);
  mVar1 = pl->m_f;
  mVar3 = hidden_bit();
  bVar2 = (mVar1 == mVar3) + 1;
  pl->m_f = pl->m_f << bVar2;
  pl->m_f = pl->m_f - 1;
  pl->m_e = pl->m_e - (uint)bVar2;
  pl->m_f = pl->m_f << ((char)pl->m_e - (char)(local_30->first).m_e & 0x1fU);
  pl->m_e = (local_30->first).m_e;
  return _auStack_18;
}

Assistant:

static std::pair<diy_fp, diy_fp> boundaries(FloatType d) noexcept
		{
			std::pair<diy_fp, diy_fp> result;
			diy_fp &mi(result.first), &pl(result.second);
			pl = diy_fp(d);
			mi = pl;

			pl.m_f <<= 1;
			pl.m_f += 1;

			pl.m_e  -= 1;


			pl.normalize_from_ieee754(); // as we increase precision of IEEE-754 type by 1

			const unsigned char shift_amount(1 + (mi.m_f == hidden_bit()));

			mi.m_f <<= shift_amount;
			mi.m_f -= 1;
			mi.m_e -= shift_amount;

			mi.m_f <<= mi.m_e - pl.m_e;
			mi.m_e = pl.m_e;

			return result;
		}